

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::AccuracyParameter::MergePartialFromCodedStream
          (AccuracyParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int64 iVar7;
  int iVar8;
  UnknownFieldSet *unknown_fields;
  char cVar9;
  uint tag;
  ulong uVar10;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003adfbc;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003adfbc:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003adfde:
      iVar8 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar8 = 6;
        if (bVar4) goto LAB_003ae018;
      }
    }
    else {
      uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar10;
      if (uVar6 != 3) {
        if (uVar6 != 2) {
          if ((uVar6 != 1) || (cVar9 != '\b')) goto LAB_003adfde;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar5 = (uint32)bVar1;
            if (-1 < (char)bVar1) {
              this->top_k_ = (uint)bVar1;
              input->buffer_ = pbVar2 + 1;
              goto LAB_003ae018;
            }
          }
          else {
            uVar5 = 0;
          }
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          this->top_k_ = (uint32)iVar7;
          iVar8 = 6;
          if (-1 < iVar7) goto LAB_003ae018;
          goto LAB_003ae01a;
        }
        if (cVar9 != '\x10') goto LAB_003adfde;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003ae0d0;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_003ae0d0:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar10;
        }
        iVar8 = 6;
        if (bVar4) {
          this->axis_ = (int32)uVar10;
          goto LAB_003ae018;
        }
        goto LAB_003ae01a;
      }
      if (cVar9 != '\x18') goto LAB_003adfde;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar10 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ae0f6;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_003ae0f6:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar10;
      }
      iVar8 = 6;
      if (bVar4) {
        this->ignore_label_ = (int32)uVar10;
LAB_003ae018:
        iVar8 = 0;
      }
    }
LAB_003ae01a:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool AccuracyParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.AccuracyParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 top_k = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_top_k();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &top_k_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 axis = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 ignore_label = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_ignore_label();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &ignore_label_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.AccuracyParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.AccuracyParameter)
  return false;
#undef DO_
}